

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O0

int zLUWorkInit(int m,int n,int panel_size,int **iworkptr,doublecomplex **dworkptr,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  doublecomplex *pdVar5;
  int local_60;
  int local_58;
  int rowblk;
  int maxsuper;
  doublecomplex *old_ptr;
  int extra;
  int dsize;
  int isize;
  GlobalLU_t *Glu_local;
  doublecomplex **dworkptr_local;
  int **iworkptr_local;
  int panel_size_local;
  int n_local;
  int m_local;
  
  iVar1 = sp_ienv(3);
  iVar2 = sp_ienv(7);
  if (iVar2 < iVar1) {
    local_58 = sp_ienv(3);
  }
  else {
    local_58 = sp_ienv(7);
  }
  iVar1 = sp_ienv(4);
  iVar2 = (panel_size * 2 + 5) * m * 4;
  local_60 = m;
  if (m <= (local_58 + iVar1) * panel_size) {
    local_60 = (local_58 + iVar1) * panel_size;
  }
  iVar1 = (m * panel_size + local_60) * 0x10;
  if (Glu->MemModel == SYSTEM) {
    piVar4 = int32Calloc((int)((ulong)(long)iVar2 >> 2));
    *iworkptr = piVar4;
  }
  else {
    piVar4 = (int *)zuser_malloc(iVar2,1,Glu);
    *iworkptr = piVar4;
  }
  if (*iworkptr == (int *)0x0) {
    fprintf(_stderr,"zLUWorkInit: malloc fails for local iworkptr[]\n");
    n_local = iVar2 + n;
  }
  else {
    if (Glu->MemModel == SYSTEM) {
      pdVar5 = (doublecomplex *)superlu_malloc((long)iVar1);
      *dworkptr = pdVar5;
    }
    else {
      pdVar5 = (doublecomplex *)zuser_malloc(iVar1,1,Glu);
      *dworkptr = pdVar5;
      if (((ulong)*dworkptr & 7) != 0) {
        pdVar5 = *dworkptr;
        *dworkptr = (doublecomplex *)((ulong)((long)&(*dworkptr)->r + 7U) & 0xfffffffffffffff8);
        *dworkptr = (doublecomplex *)&(*dworkptr)[-1].i;
        iVar3 = (int)pdVar5 - (int)*dworkptr;
        (Glu->stack).top2 = (Glu->stack).top2 - iVar3;
        (Glu->stack).used = iVar3 + (Glu->stack).used;
      }
    }
    if (*dworkptr == (doublecomplex *)0x0) {
      fprintf(_stderr,"malloc fails for local dworkptr[].");
      n_local = iVar2 + iVar1 + n;
    }
    else {
      n_local = 0;
    }
  }
  return n_local;
}

Assistant:

int
zLUWorkInit(int m, int n, int panel_size, int **iworkptr, 
            doublecomplex **dworkptr, GlobalLU_t *Glu)
{
    int    isize, dsize, extra;
    doublecomplex *old_ptr;
    int    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
           rowblk   = sp_ienv(4);

    /* xplore[m] and xprune[n] can be 64-bit; they are allocated separately */
    //isize = ( (2 * panel_size + 3 + NO_MARKER ) * m + n ) * sizeof(int);
    isize = ( (2 * panel_size + 2 + NO_MARKER ) * m ) * sizeof(int);
    dsize = (m * panel_size +
	     NUM_TEMPV(m,panel_size,maxsuper,rowblk)) * sizeof(doublecomplex);
    
    if ( Glu->MemModel == SYSTEM ) 
	*iworkptr = (int *) int32Calloc(isize/sizeof(int));
    else
	*iworkptr = (int *) zuser_malloc(isize, TAIL, Glu);
    if ( ! *iworkptr ) {
	fprintf(stderr, "zLUWorkInit: malloc fails for local iworkptr[]\n");
	return (isize + n);
    }

    if ( Glu->MemModel == SYSTEM )
	*dworkptr = (doublecomplex *) SUPERLU_MALLOC(dsize);
    else {
	*dworkptr = (doublecomplex *) zuser_malloc(dsize, TAIL, Glu);
	if ( NotDoubleAlign(*dworkptr) ) {
	    old_ptr = *dworkptr;
	    *dworkptr = (doublecomplex*) DoubleAlign(*dworkptr);
	    *dworkptr = (doublecomplex*) ((double*)*dworkptr - 1);
	    extra = (char*)old_ptr - (char*)*dworkptr;
#if ( DEBUGlevel>=1 )
	    printf("zLUWorkInit: not aligned, extra %d\n", extra); fflush(stdout);
#endif	    
	    Glu->stack.top2 -= extra;
	    Glu->stack.used += extra;
	}
    }
    if ( ! *dworkptr ) {
	fprintf(stderr, "malloc fails for local dworkptr[].");
	return (isize + dsize + n);
    }
	
    return 0;
}